

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void modify_location(CHAR_DATA *ch,int location,int mod,bool add)

{
  short sVar1;
  bool bVar2;
  byte in_CL;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int i;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  int local_18;
  int local_10;
  
  local_10 = in_EDX;
  if ((in_CL & 1) == 0) {
    local_10 = -in_EDX;
  }
  sVar1 = (short)local_10;
  switch(in_ESI) {
  case 0:
    break;
  case 1:
    *(short *)(in_RDI + 0x272) = *(short *)(in_RDI + 0x272) + sVar1;
    break;
  case 2:
    *(short *)(in_RDI + 0x278) = *(short *)(in_RDI + 0x278) + sVar1;
    break;
  case 3:
    *(short *)(in_RDI + 0x274) = *(short *)(in_RDI + 0x274) + sVar1;
    break;
  case 4:
    *(short *)(in_RDI + 0x276) = *(short *)(in_RDI + 0x276) + sVar1;
    break;
  case 5:
    *(short *)(in_RDI + 0x27a) = *(short *)(in_RDI + 0x27a) + sVar1;
    break;
  case 6:
    *(short *)(in_RDI + 0x134) = *(short *)(in_RDI + 0x134) + sVar1;
    break;
  case 7:
    break;
  case 9:
    break;
  case 10:
    break;
  case 0xb:
    break;
  case 0xc:
    *(short *)(in_RDI + 0x160) = *(short *)(in_RDI + 0x160) + sVar1;
    break;
  case 0xd:
    *(short *)(in_RDI + 0x15c) = *(short *)(in_RDI + 0x15c) + sVar1;
    break;
  case 0xe:
    *(short *)(in_RDI + 0x164) = *(short *)(in_RDI + 0x164) + sVar1;
    break;
  case 0xf:
    break;
  case 0x10:
    break;
  case 0x11:
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      *(short *)(in_RDI + 0x20a + (long)local_18 * 2) =
           *(short *)(in_RDI + 0x20a + (long)local_18 * 2) + sVar1;
    }
    break;
  case 0x12:
    *(short *)(in_RDI + 0x206) = *(short *)(in_RDI + 0x206) + sVar1;
    break;
  case 0x13:
    *(short *)(in_RDI + 0x208) = *(short *)(in_RDI + 0x208) + sVar1;
    break;
  case 0x14:
    *(short *)(in_RDI + 0x202) = *(short *)(in_RDI + 0x202) + sVar1;
    break;
  case 0x15:
    *(short *)(in_RDI + 0x202) = *(short *)(in_RDI + 0x202) + sVar1;
    break;
  case 0x16:
    *(short *)(in_RDI + 0x202) = *(short *)(in_RDI + 0x202) + sVar1;
    break;
  case 0x17:
    *(short *)(in_RDI + 0x202) = *(short *)(in_RDI + 0x202) + sVar1;
    break;
  case 0x18:
    *(short *)(in_RDI + 0x202) = *(short *)(in_RDI + 0x202) + sVar1;
    break;
  case 0x19:
    *(short *)(in_RDI + 0x202) = *(short *)(in_RDI + 0x202) + sVar1;
    break;
  case 0x1a:
    break;
  case 0x1b:
    *(short *)(in_RDI + 0x1fe) = *(short *)(in_RDI + 0x1fe) + sVar1;
    break;
  case 0x1c:
    *(short *)(in_RDI + 0x300) = *(short *)(in_RDI + 0x300) + sVar1;
    break;
  case 0x1d:
    *(short *)(in_RDI + 0x154) = *(short *)(in_RDI + 0x154) + sVar1;
    break;
  case 0x1e:
    *(short *)(in_RDI + 0x2a0) = *(short *)(in_RDI + 0x2a0) + sVar1;
    break;
  case 0x1f:
    bVar2 = is_npc(in_stack_ffffffffffffffd8);
    if (!bVar2) {
      *(short *)(*(long *)(in_RDI + 0xc0) + 0xbe0) =
           *(short *)(*(long *)(in_RDI + 0xc0) + 0xbe0) + sVar1;
    }
    break;
  case 0x20:
    if ((in_CL & 1) == 0) {
      *(float *)(in_RDI + 0x2fc) =
           (1.0 / ((float)-local_10 / 100.0 + 1.0)) * *(float *)(in_RDI + 0x2fc);
    }
    else {
      *(float *)(in_RDI + 0x2fc) = ((float)local_10 / 100.0 + 1.0) * *(float *)(in_RDI + 0x2fc);
    }
    break;
  case 0x21:
    *(short *)(in_RDI + 0x306) = *(short *)(in_RDI + 0x306) + sVar1;
    break;
  case 0x22:
    *(short *)(in_RDI + 0x304) = *(short *)(in_RDI + 0x304) + sVar1;
    break;
  case 0x23:
    if (*(short *)(*(long *)(in_RDI + 0xc0) + 0x3d8) + local_10 < 0xb) {
      *(short *)(*(long *)(in_RDI + 0xc0) + 0x3d8) =
           *(short *)(*(long *)(in_RDI + 0xc0) + 0x3d8) + sVar1;
    }
    else {
      *(undefined2 *)(*(long *)(in_RDI + 0xc0) + 0x3d8) = 10;
    }
    break;
  case 0x24:
    *(short *)(in_RDI + 0x204) = *(short *)(in_RDI + 0x204) + sVar1;
    break;
  case 0x25:
    bVar2 = is_npc(in_stack_ffffffffffffffd8);
    if (!bVar2) {
      *(short *)(*(long *)(in_RDI + 0xc0) + 0x7e) =
           *(short *)(*(long *)(in_RDI + 0xc0) + 0x7e) + sVar1;
    }
  }
  return;
}

Assistant:

void modify_location(CHAR_DATA *ch, int location, int mod, bool add)
{
	int i;
	if (!add)
		mod = 0 - mod;

	switch (location)
	{
		case APPLY_NONE:
			break;
		case APPLY_STR:
			ch->mod_stat[STAT_STR] += mod;
			break;
		case APPLY_DEX:
			ch->mod_stat[STAT_DEX] += mod;
			break;
		case APPLY_INT:
			ch->mod_stat[STAT_INT] += mod;
			break;
		case APPLY_WIS:
			ch->mod_stat[STAT_WIS] += mod;
			break;
		case APPLY_CON:
			ch->mod_stat[STAT_CON] += mod;
			break;
		case APPLY_SEX:
			ch->sex += mod;
			break;
		case APPLY_CLASS:
			break;
		case APPLY_AGE:
			break;
		case APPLY_HEIGHT:
			break;
		case APPLY_WEIGHT:
			break;
		case APPLY_MANA:
			ch->max_mana += mod;
			break;
		case APPLY_HIT:
			ch->max_hit += mod;
			break;
		case APPLY_MOVE:
			ch->max_move += mod;
			break;
		case APPLY_GOLD:
			break;
		case APPLY_EXP:
			break;
		case APPLY_AC:
			for (i = 0; i < 4; i++)
				ch->armor[i] += mod;
			break;
		case APPLY_HITROLL:
			ch->hitroll += mod;
			break;
		case APPLY_DAMROLL:
			ch->damroll += mod;
			break;
		case APPLY_SAVES:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_PARA:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_ROD:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_PETRI:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_BREATH:
			ch->saving_throw += mod;
			break;
		case APPLY_SAVING_SPELL:
			ch->saving_throw += mod;
			break;
		case APPLY_SPELL_AFFECT:
			break;
		case APPLY_CARRY_WEIGHT:
			ch->carry_weight += mod;
			break;
		case APPLY_DEFENSE:
			ch->defense_mod += mod;
			break;
		case APPLY_SIZE:
			ch->size += mod;
			break;
		case APPLY_REGENERATION:
			ch->regen_rate += mod;
			break;
		case APPLY_ENERGYSTATE:
			if (!is_npc(ch))
				ch->pcdata->energy_state += mod;
			break;
		case APPLY_ARMS:
			ch->arms += mod;
			break;
		case APPLY_LEGS:
			ch->legs += mod;
			break;
		case APPLY_ALIGNMENT:
			ch->alignment += mod;
			break;
		case APPLY_ETHOS:
			if (!is_npc(ch))
				ch->pcdata->ethos += mod;
			break;
		case APPLY_BEAUTY:
			if (ch->pcdata->beauty + mod > MAX_BEAUTY)
				ch->pcdata->beauty = MAX_BEAUTY;
			else
				ch->pcdata->beauty += mod;
			break;
		case APPLY_DAM_MOD:
			if (add)
				ch->dam_mod *= (1.00f + (float)mod / 100.00f);
			else
			{
				mod = 0 - mod;
				ch->dam_mod *= 1.00f / (1.00f + (float)mod / 100.00f);
			}
			break;
	}
}